

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_init_gnss_glo(fsnav_gnss_glo *glo,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  glo->sat = (fsnav_gnss_sat *)0x0;
  glo->freq_slot = (int *)0x0;
  glo->max_sat_count = 0;
  glo->max_eph_count = 0;
  glo->sat = pfVar1;
  if (pfVar1 != (fsnav_gnss_sat *)0x0) {
    piVar2 = (int *)calloc(max_sat_count,4);
    glo->freq_slot = piVar2;
    glo->max_sat_count = max_sat_count;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < max_sat_count; uVar5 = uVar5 + 1) {
      fsnav_init_gnss_sat((fsnav_gnss_sat *)((long)glo->sat->x + lVar4 + -0x30));
      max_sat_count = glo->max_sat_count;
      lVar4 = lVar4 + 0x90;
    }
    lVar6 = max_sat_count + 1;
    lVar4 = 0;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        glo->max_eph_count = max_eph_count;
        glo->obs_types = (char (*) [4])0x0;
        glo->obs_count = 0;
        return '\x01';
      }
      pvVar3 = calloc(max_eph_count,8);
      *(void **)((long)glo->sat->x + lVar4 + -0x30) = pvVar3;
      lVar4 = lVar4 + 0x90;
    } while (pvVar3 != (void *)0x0);
  }
  return '\0';
}

Assistant:

char fsnav_init_gnss_glo(fsnav_gnss_glo* glo, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	glo->sat = NULL;
	glo->freq_slot = NULL;
	glo->max_sat_count = 0;
	glo->max_eph_count = 0;

	// try to allocate memory for satellite data
	glo->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (glo->sat == NULL)
		return 0;
	glo->freq_slot = (int*)calloc(max_sat_count, sizeof(int));
	glo->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < glo->max_sat_count; i++)
		fsnav_init_gnss_sat(glo->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < glo->max_sat_count; i++) {
		glo->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (glo->sat[i].eph == NULL)
			return 0;
	}
	glo->max_eph_count = max_eph_count;

	// observation types
	glo->obs_types = NULL;
	glo->obs_count = 0;

	return 1;
}